

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

Bool prvTidynodeHasText(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Bool BVar2;
  ulong uVar3;
  
  BVar2 = no;
  if (node != (Node *)0x0 && doc != (TidyDocImpl *)0x0) {
    pLVar1 = doc->lexer;
    uVar3 = (ulong)node->start;
    do {
      if (node->end <= uVar3) {
        return no;
      }
      BVar2 = prvTidyIsWhite((int)pLVar1->lexbuf[uVar3]);
      uVar3 = uVar3 + 1;
    } while (BVar2 != no);
    BVar2 = yes;
  }
  return BVar2;
}

Assistant:

Bool TY_(nodeHasText)( TidyDocImpl* doc, Node* node )
{
  if ( doc && node )
  {
    uint ix;
    Lexer* lexer = doc->lexer;
    for ( ix = node->start; ix < node->end; ++ix )
    {
        /* whitespace */
        if ( !TY_(IsWhite)( lexer->lexbuf[ix] ) )
            return yes;
    }
  }
  return no;
}